

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_implicit_r(lyd_node *parent,lyd_node **first,lysc_node *sparent,lys_module *mod,
                         ly_set *node_when,ly_set *node_types,ly_set *ext_node,uint32_t impl_opts,
                         ly_ht *getnext_ht,lyd_node **diff)

{
  LY_ERR LVar1;
  lyd_node *node;
  lyd_node **first_00;
  
  LVar1 = lyd_new_implicit(parent,first,sparent,mod,node_when,node_types,ext_node,impl_opts,
                           getnext_ht,diff);
  if (LVar1 == LY_SUCCESS) {
    if (parent == (lyd_node *)0x0) {
      node = *first;
    }
    else {
      node = lyd_child_no_keys(parent);
    }
    for (; node != (lyd_node *)0x0; node = node->next) {
      if (((node->flags & 1) != 0) && (node->schema->nodetype == 1)) {
        first_00 = lyd_node_child_p(node);
        LVar1 = lyd_new_implicit_r(node,first_00,(lysc_node *)0x0,mod,node_when,node_types,ext_node,
                                   impl_opts,getnext_ht,diff);
        if (LVar1 != LY_SUCCESS) {
          return LVar1;
        }
      }
    }
    LVar1 = LY_SUCCESS;
  }
  return LVar1;
}

Assistant:

LY_ERR
lyd_new_implicit_r(struct lyd_node *parent, struct lyd_node **first, const struct lysc_node *sparent,
        const struct lys_module *mod, struct ly_set *node_when, struct ly_set *node_types, struct ly_set *ext_node,
        uint32_t impl_opts, struct ly_ht *getnext_ht, struct lyd_node **diff)
{
    struct lyd_node *child;

    /* parent children */
    LY_CHECK_RET(lyd_new_implicit(parent, first, sparent, mod, node_when, node_types, ext_node, impl_opts, getnext_ht, diff));

    LY_LIST_FOR(parent ? lyd_child_no_keys(parent) : *first, child) {
        /* recursively for all the containers */
        if ((child->flags & LYD_DEFAULT) && (child->schema->nodetype == LYS_CONTAINER)) {
            LY_CHECK_RET(lyd_new_implicit_r(child, lyd_node_child_p(child), NULL, mod, node_when, node_types, ext_node,
                    impl_opts, getnext_ht, diff));
        }
    }

    return LY_SUCCESS;
}